

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::multiply_fans(Omega_h *this,LOs *a2b,LOs *a2c)

{
  void *extraout_RDX;
  LOs LVar1;
  LOs degrees;
  LOs c_degrees;
  LOs b_degrees;
  allocator local_d1;
  string local_d0;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  Write<int> local_30;
  
  Write<int>::Write(&local_40,&a2b->write_);
  std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_a0);
  get_degrees((Omega_h *)&local_30,(LOs *)&local_40,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  Write<int>::~Write(&local_40);
  Write<int>::Write(&local_50,&a2c->write_);
  std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_b0);
  get_degrees((Omega_h *)&local_a0,(LOs *)&local_50,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  Write<int>::~Write(&local_50);
  Write<int>::Write(&local_70,&local_30);
  Write<int>::Write(&local_80,&local_a0);
  std::__cxx11::string::string((string *)&local_d0,"",&local_d1);
  multiply_each<int>((Omega_h *)&local_60,(Read<int> *)&local_70,(Read<int> *)&local_80,&local_d0);
  Read<int>::Read((Read<signed_char> *)&local_b0,&local_60);
  Write<int>::~Write(&local_60);
  std::__cxx11::string::~string((string *)&local_d0);
  Write<int>::~Write(&local_80);
  Write<int>::~Write(&local_70);
  Write<int>::Write(&local_90,&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"",&local_d1);
  offset_scan<int>(this,(Read<int> *)&local_90,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  Write<int>::~Write(&local_90);
  Write<int>::~Write(&local_b0);
  Write<int>::~Write(&local_a0);
  Write<int>::~Write(&local_30);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs multiply_fans(LOs a2b, LOs a2c) {
  auto b_degrees = get_degrees(a2b);
  auto c_degrees = get_degrees(a2c);
  LOs degrees = multiply_each(b_degrees, c_degrees);
  auto a2bc = offset_scan(degrees);
  return a2bc;
}